

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

bool __thiscall QMetaType::load(QMetaType *this,QDataStream *stream,void *data)

{
  bool bVar1;
  int iVar2;
  QMetaTypeInterface *pQVar3;
  long in_FS_OFFSET;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((data == (void *)0x0) || (pQVar3 = this->d_ptr, pQVar3 == (QMetaTypeInterface *)0x0)) {
LAB_002929ca:
    bVar1 = false;
  }
  else {
    iVar2 = (pQVar3->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar2 == 0) {
      iVar2 = registerHelper(pQVar3);
    }
    if (iVar2 == 0x20) {
LAB_0029298b:
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(stream,(qint64 *)&local_28);
      *(undefined1 **)data = local_28;
    }
    else {
      pQVar3 = this->d_ptr;
      if (pQVar3 == (QMetaTypeInterface *)0x0) {
        pQVar3 = (QMetaTypeInterface *)0x0;
      }
      else {
        iVar2 = (pQVar3->typeId)._q_value.super___atomic_base<int>._M_i;
        if (iVar2 == 0) {
          iVar2 = registerHelper(pQVar3);
        }
        if (iVar2 == 0x23) goto LAB_0029298b;
        pQVar3 = this->d_ptr;
      }
      if (pQVar3->dataStreamIn == (DataStreamInFn)0x0) goto LAB_002929ca;
      (*pQVar3->dataStreamIn)(pQVar3,stream,data);
    }
    bVar1 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaType::load(QDataStream &stream, void *data) const
{
    if (!data || !isValid())
        return false;

    // keep compatibility for long/ulong
    if (id() == QMetaType::Long) {
        qlonglong ll;
        stream >> ll;
        *(long *)data = long(ll);
        return true;
    } else if (id() == QMetaType::ULong) {
        qulonglong ull;
        stream >> ull;
        *(unsigned long *)data = (unsigned long)(ull);
        return true;
    }
    if (!d_ptr->dataStreamIn)
        return false;

    d_ptr->dataStreamIn(d_ptr, stream, data);
    return true;
}